

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<short>,_ImPlot::TransformerLogLog>::operator()
          (LineStripRenderer<ImPlot::GetterYs<short>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  short sVar7;
  int iVar8;
  ImU32 IVar9;
  GetterYs<short> *pGVar10;
  TransformerLogLog *pTVar11;
  ImPlotPlot *pIVar12;
  ImDrawVert *pIVar13;
  uint *puVar14;
  ImPlotContext *pIVar15;
  bool bVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pIVar15 = GImPlot;
  pGVar10 = this->Getter;
  pTVar11 = this->Transformer;
  iVar8 = pGVar10->Count;
  sVar7 = *(short *)((long)pGVar10->Ys +
                    (long)(((prim + 1 + pGVar10->Offset) % iVar8 + iVar8) % iVar8) *
                    (long)pGVar10->Stride);
  dVar18 = log10(((double)(prim + 1) * pGVar10->XScale + pGVar10->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar15->LogDenX;
  pIVar12 = pIVar15->CurrentPlot;
  dVar3 = (pIVar12->XAxis).Range.Min;
  dVar4 = (pIVar12->XAxis).Range.Max;
  dVar19 = log10((double)(int)sVar7 / pIVar12->YAxis[pTVar11->YAxis].Range.Min);
  iVar8 = pTVar11->YAxis;
  pIVar12 = pIVar15->CurrentPlot;
  dVar5 = pIVar12->YAxis[iVar8].Range.Min;
  fVar22 = (float)((((double)(float)(dVar18 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar12->XAxis).Range.Min) * pIVar15->Mx +
                  (double)pIVar15->PixelRange[iVar8].Min.x);
  fVar23 = (float)((((double)(float)(dVar19 / pIVar15->LogDenY[iVar8]) *
                     (pIVar12->YAxis[iVar8].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar15->My[iVar8] + (double)pIVar15->PixelRange[iVar8].Min.y);
  fVar21 = (this->P1).x;
  fVar24 = (this->P1).y;
  fVar20 = fVar24;
  if (fVar23 <= fVar24) {
    fVar20 = fVar23;
  }
  bVar16 = false;
  if ((fVar20 < (cull_rect->Max).y) &&
     (fVar20 = (float)(-(uint)(fVar23 <= fVar24) & (uint)fVar24 |
                      ~-(uint)(fVar23 <= fVar24) & (uint)fVar23), pfVar1 = &(cull_rect->Min).y,
     bVar16 = false, *pfVar1 <= fVar20 && fVar20 != *pfVar1)) {
    fVar20 = fVar21;
    if (fVar22 <= fVar21) {
      fVar20 = fVar22;
    }
    if (fVar20 < (cull_rect->Max).x) {
      fVar20 = (float)(~-(uint)(fVar22 <= fVar21) & (uint)fVar22 |
                      -(uint)(fVar22 <= fVar21) & (uint)fVar21);
      bVar16 = (cull_rect->Min).x <= fVar20 && fVar20 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar20 = this->Weight;
    IVar9 = this->Col;
    IVar6 = *uv;
    fVar21 = fVar22 - fVar21;
    fVar24 = fVar23 - fVar24;
    fVar17 = fVar21 * fVar21 + fVar24 * fVar24;
    if (0.0 < fVar17) {
      if (fVar17 < 0.0) {
        fVar17 = sqrtf(fVar17);
      }
      else {
        fVar17 = SQRT(fVar17);
      }
      fVar21 = fVar21 * (1.0 / fVar17);
      fVar24 = fVar24 * (1.0 / fVar17);
    }
    fVar20 = fVar20 * 0.5;
    fVar21 = fVar21 * fVar20;
    fVar20 = fVar20 * fVar24;
    pIVar13 = DrawList->_VtxWritePtr;
    (pIVar13->pos).x = (this->P1).x + fVar20;
    (pIVar13->pos).y = (this->P1).y - fVar21;
    pIVar13->uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar9;
    pIVar13[1].pos.x = fVar20 + fVar22;
    pIVar13[1].pos.y = fVar23 - fVar21;
    pIVar13[1].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar9;
    pIVar13[2].pos.x = fVar22 - fVar20;
    pIVar13[2].pos.y = fVar21 + fVar23;
    pIVar13[2].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar9;
    pIVar13[3].pos.x = (this->P1).x - fVar20;
    pIVar13[3].pos.y = fVar21 + (this->P1).y;
    pIVar13[3].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    puVar14 = DrawList->_IdxWritePtr;
    *puVar14 = DrawList->_VtxCurrentIdx;
    puVar14[1] = DrawList->_VtxCurrentIdx + 1;
    puVar14[2] = DrawList->_VtxCurrentIdx + 2;
    puVar14[3] = DrawList->_VtxCurrentIdx;
    puVar14[4] = DrawList->_VtxCurrentIdx + 2;
    puVar14[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar14 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar6.y = fVar23;
  IVar6.x = fVar22;
  this->P1 = IVar6;
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }